

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Combine<duckdb::ArgMinMaxState<double,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<double,_duckdb::hugeint_t> *source,
               ArgMinMaxState<double,_duckdb::hugeint_t> *target,AggregateInputData *param_3)

{
  int64_t iVar1;
  bool bVar2;
  
  if (((source->super_ArgMinMaxStateBase).is_initialized == true) &&
     (((target->super_ArgMinMaxStateBase).is_initialized != true ||
      (bVar2 = GreaterThan::Operation<duckdb::hugeint_t>(&target->value,&source->value), bVar2)))) {
    target->arg = source->arg;
    iVar1 = (source->value).upper;
    (target->value).lower = (source->value).lower;
    (target->value).upper = iVar1;
    (target->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}